

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O1

object_ptr __thiscall mjs::new_string(mjs *this,gc_heap_ptr<mjs::global_object> *global,string *val)

{
  size_t num_bytes;
  long *plVar1;
  void *pvVar2;
  undefined8 extraout_RDX;
  object_ptr oVar3;
  object_ptr proto;
  undefined1 local_50 [32];
  gc_heap_ptr_untyped local_30;
  
  plVar1 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar1 + 0x68))(local_50 + 0x10,plVar1);
  pvVar2 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  num_bytes = *(size_t *)((long)pvVar2 + 8);
  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_50 + 0x10));
  object::class_name((object *)&local_30);
  gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  gc_heap::
  allocate_and_construct<mjs::string_object,mjs::string,mjs::gc_heap_ptr<mjs::object>&,mjs::string_const&,bool>
            ((gc_heap *)local_50,num_bytes,(string *)0x30,(gc_heap_ptr<mjs::object> *)&local_30,
             (string *)(local_50 + 0x10),(bool *)val);
  *(undefined8 *)this = local_50._0_8_;
  *(undefined4 *)(this + 8) = local_50._8_4_;
  if ((gc_heap *)local_50._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_50._0_8_,(gc_heap_ptr_untyped *)this);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_50);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_30);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_50 + 0x10));
  oVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar3.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr new_string(const gc_heap_ptr<global_object>& global, const string& val) {
    auto proto = global->string_prototype();
    return global->heap().make<string_object>(proto->class_name(), proto, val, global->language_version() >= version::es5);
}